

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

GLchar * gl4cts::ShaderSubroutine::Utils::pnameToStr(GLenum pname)

{
  char *pcVar1;
  TestError *this;
  
  if ((int)pname < 0x8e47) {
    if ((int)pname < 0x8de5) {
      if (pname == 0x8a38) {
        pcVar1 = "GL_UNIFORM_SIZE";
      }
      else {
        if (pname != 0x8a39) goto switchD_009695c7_caseD_92f7;
        pcVar1 = "GL_UNIFORM_NAME_LENGTH";
      }
    }
    else if (pname == 0x8de5) {
      pcVar1 = "GL_ACTIVE_SUBROUTINES";
    }
    else {
      if (pname != 0x8de6) goto switchD_009695c7_caseD_92f7;
      pcVar1 = "GL_ACTIVE_SUBROUTINE_UNIFORMS";
    }
  }
  else {
    switch(pname) {
    case 0x8e47:
      pcVar1 = "GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS";
      break;
    case 0x8e48:
      pcVar1 = "GL_ACTIVE_SUBROUTINE_MAX_LENGTH";
      break;
    case 0x8e49:
      pcVar1 = "GL_ACTIVE_SUBROUTINE_UNIFORM_MAX_LENGTH";
      break;
    case 0x8e4a:
      pcVar1 = "GL_NUM_COMPATIBLE_SUBROUTINES";
      break;
    case 0x8e4b:
      pcVar1 = "GL_COMPATIBLE_SUBROUTINES";
      break;
    default:
      switch(pname) {
      case 0x92f5:
        pcVar1 = "GL_ACTIVE_RESOURCES";
        break;
      case 0x92f6:
        pcVar1 = "GL_MAX_NAME_LENGTH";
        break;
      case 0x92f7:
      case 0x92fa:
switchD_009695c7_caseD_92f7:
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Not implemented",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x56a);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      case 0x92f8:
        pcVar1 = "GL_MAX_NUM_COMPATIBLE_SUBROUTINES";
        break;
      case 0x92f9:
        pcVar1 = "GL_NAME_LENGTH";
        break;
      case 0x92fb:
        pcVar1 = "GL_ARRAY_SIZE";
        break;
      default:
        if (pname != 0x930e) goto switchD_009695c7_caseD_92f7;
        pcVar1 = "GL_LOCATION";
      }
    }
  }
  return pcVar1;
}

Assistant:

const GLchar* Utils::pnameToStr(glw::GLenum pname)
{
	const GLchar* string = "Unknown pname";

	switch (pname)
	{
	case GL_ACTIVE_SUBROUTINE_UNIFORMS:
		string = "GL_ACTIVE_SUBROUTINE_UNIFORMS";
		break;
	case GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS:
		string = "GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS";
		break;
	case GL_ACTIVE_SUBROUTINES:
		string = "GL_ACTIVE_SUBROUTINES";
		break;
	case GL_ACTIVE_SUBROUTINE_UNIFORM_MAX_LENGTH:
		string = "GL_ACTIVE_SUBROUTINE_UNIFORM_MAX_LENGTH";
		break;
	case GL_ACTIVE_SUBROUTINE_MAX_LENGTH:
		string = "GL_ACTIVE_SUBROUTINE_MAX_LENGTH";
		break;
	case GL_NUM_COMPATIBLE_SUBROUTINES:
		string = "GL_NUM_COMPATIBLE_SUBROUTINES";
		break;
	case GL_UNIFORM_SIZE:
		string = "GL_UNIFORM_SIZE";
		break;
	case GL_COMPATIBLE_SUBROUTINES:
		string = "GL_COMPATIBLE_SUBROUTINES";
		break;
	case GL_UNIFORM_NAME_LENGTH:
		string = "GL_UNIFORM_NAME_LENGTH";
		break;
	case GL_ACTIVE_RESOURCES:
		string = "GL_ACTIVE_RESOURCES";
		break;
	case GL_MAX_NAME_LENGTH:
		string = "GL_MAX_NAME_LENGTH";
		break;
	case GL_MAX_NUM_COMPATIBLE_SUBROUTINES:
		string = "GL_MAX_NUM_COMPATIBLE_SUBROUTINES";
		break;
	case GL_NAME_LENGTH:
		string = "GL_NAME_LENGTH";
		break;
	case GL_ARRAY_SIZE:
		string = "GL_ARRAY_SIZE";
		break;
	case GL_LOCATION:
		string = "GL_LOCATION";
		break;
	default:
		TCU_FAIL("Not implemented");
		break;
	};

	return string;
}